

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  double *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R9D;
  bool bVar5;
  bool bVar6;
  float axis_00;
  float fVar7;
  float fVar8;
  float lhs;
  float fVar9;
  float fVar10;
  double in_XMM0_Qa;
  double dVar11;
  double in_XMM1_Qa;
  ImVec2 *in_stack_00000008;
  float grab_pos_1;
  float grab_t_1;
  double v_new_1;
  float new_clicked_t;
  double v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  bool tweak_fast;
  bool tweak_slow;
  float input_delta;
  bool clicked_around_grab;
  float grab_pos;
  float grab_t;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  double v_range;
  bool is_floating_point;
  bool is_logarithmic;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  float local_124;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  float in_stack_fffffffffffffee8;
  float fVar12;
  char cVar13;
  float in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  double local_108;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  float local_d4;
  ImRect local_d0;
  double local_c0;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  ImGuiDataType data_type_00;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff67;
  float in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  uint data_type_01;
  undefined1 uVar14;
  byte bVar15;
  float local_64;
  
  pIVar1 = GImGui;
  data_type_00 = (ImGuiDataType)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  uVar3 = (uint)((in_R9D & 0x100000) != 0);
  bVar5 = in_EDX == 8;
  bVar6 = in_EDX == 9;
  if (in_XMM1_Qa <= in_XMM0_Qa) {
    local_108 = in_XMM0_Qa - in_XMM1_Qa;
  }
  else {
    local_108 = in_XMM1_Qa - in_XMM0_Qa;
  }
  axis_00 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar7 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar7 = (axis_00 - fVar7) - 4.0;
  local_64 = (pIVar1->Style).GrabMinSize;
  local_124 = in_stack_ffffffffffffff60;
  if ((!bVar5 && !bVar6) && (0.0 <= local_108)) {
    local_64 = ImMax<float>((float)((double)fVar7 / (local_108 + 1.0)),(pIVar1->Style).GrabMinSize);
    local_124 = in_stack_ffffffffffffff60;
  }
  fVar8 = ImMin<float>(local_64,fVar7);
  lhs = fVar7 - fVar8;
  fVar9 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar9 = fVar8 * 0.5 + fVar9 + 2.0;
  fVar10 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar10 = -fVar8 * 0.5 + (fVar10 - 2.0);
  if ((in_R9D & 0x20) != 0) {
    if (bVar5 || bVar6) {
      in_stack_fffffffffffffef0 =
           ImParseFormatPrecision
                     ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                      (int)in_stack_fffffffffffffee4);
    }
    else {
      in_stack_fffffffffffffef0 = 1;
    }
    ImPow(0.0,7.495148e-39);
    in_stack_fffffffffffffeec = (pIVar1->Style).LogSliderDeadzone * 0.5;
    ImMax<float>(lhs,1.0);
  }
  data_type_01 = in_stack_ffffffffffffff80 & 0xffffff;
  if (pIVar1->ActiveId == in_ESI) {
    data_type_01 = in_stack_ffffffffffffff80 & 0xffff;
    in_stack_ffffffffffffff7c = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar4 = ImVec2::operator[](&(pIVar1->IO).MousePos,(long)(int)uVar3);
        in_stack_ffffffffffffff78 = *pfVar4;
        fVar12 = in_stack_fffffffffffffee8;
        if ((pIVar1->ActiveIdIsJustActivated & 1U) != 0) {
          in_stack_ffffffffffffff74 =
               ScaleRatioFromValueT<double,double,double>
                         (data_type_01,
                          (double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (bool)in_stack_ffffffffffffff67,local_124,in_stack_ffffffffffffff5c);
          if (uVar3 == 1) {
            in_stack_ffffffffffffff74 = 1.0 - in_stack_ffffffffffffff74;
          }
          in_stack_ffffffffffffff70 = ImLerp<float>(fVar9,fVar10,in_stack_ffffffffffffff74);
          fVar12 = (float)((uint)in_stack_fffffffffffffee8 & 0xffffff);
          if ((-fVar8 * 0.5 + in_stack_ffffffffffffff70) - 1.0 <= in_stack_ffffffffffffff78) {
            fVar12 = (float)CONCAT13(in_stack_ffffffffffffff78 <=
                                     fVar8 * 0.5 + in_stack_ffffffffffffff70 + 1.0,
                                     SUB43(in_stack_fffffffffffffee8,0));
          }
          cVar13 = (char)((uint)fVar12 >> 0x18);
          in_stack_ffffffffffffff6c = CONCAT13(cVar13,(int3)in_stack_ffffffffffffff6c);
          if ((cVar13 == '\0') || (!bVar5 && !bVar6)) {
            in_stack_fffffffffffffee4 = 0.0;
          }
          else {
            in_stack_fffffffffffffee4 = in_stack_ffffffffffffff78 - in_stack_ffffffffffffff70;
          }
          pIVar1->SliderGrabClickOffset = in_stack_fffffffffffffee4;
        }
        if (0.0 < lhs) {
          in_stack_ffffffffffffff7c =
               ImSaturate(((in_stack_ffffffffffffff78 - pIVar1->SliderGrabClickOffset) - fVar9) /
                          lhs);
        }
        if (uVar3 == 1) {
          in_stack_ffffffffffffff7c = 1.0 - in_stack_ffffffffffffff7c;
        }
        data_type_01 = CONCAT13((char)(data_type_01 >> 0x18),CONCAT12(1,(short)data_type_01));
        in_stack_fffffffffffffee8 = fVar12;
      }
    }
    else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar1->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar1->SliderCurrentAccum = 0.0;
        pIVar1->SliderCurrentAccumDirty = false;
      }
      if (uVar3 == 0) {
        in_stack_fffffffffffffee0 = GetNavTweakPressedAmount((ImGuiAxis)axis_00);
      }
      else {
        in_stack_fffffffffffffee0 = GetNavTweakPressedAmount((ImGuiAxis)axis_00);
        in_stack_fffffffffffffee0 = -in_stack_fffffffffffffee0;
      }
      if ((in_stack_fffffffffffffee0 != 0.0) ||
         (in_stack_ffffffffffffff68 = in_stack_fffffffffffffee0, NAN(in_stack_fffffffffffffee0))) {
        in_stack_ffffffffffffff68 = in_stack_fffffffffffffee0;
        in_stack_ffffffffffffff67 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
        bVar2 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
        if (bVar5 || bVar6) {
          local_124 = (float)ImParseFormatPrecision
                                       ((char *)CONCAT44(in_stack_fffffffffffffeec,
                                                         in_stack_fffffffffffffee8),
                                        (int)in_stack_fffffffffffffee4);
        }
        else {
          local_124 = 0.0;
        }
        if ((int)local_124 < 1) {
          if (((-100.0 <= local_108) && (local_108 <= 100.0)) ||
             ((in_stack_ffffffffffffff67 & 1) != 0)) {
            in_stack_ffffffffffffff68 =
                 (float)(~-(uint)(in_stack_ffffffffffffff68 < 0.0) & 0x3f800000 |
                        -(uint)(in_stack_ffffffffffffff68 < 0.0) & 0xbf800000) / (float)local_108;
          }
          else {
            in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 / 100.0;
          }
        }
        else {
          in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 / 100.0;
          if ((in_stack_ffffffffffffff67 & 1) != 0) {
            in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 / 10.0;
          }
        }
        if (bVar2) {
          in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 * 10.0;
        }
        pIVar1->SliderCurrentAccum = in_stack_ffffffffffffff68 + pIVar1->SliderCurrentAccum;
        pIVar1->SliderCurrentAccumDirty = true;
      }
      in_stack_ffffffffffffff5c = pIVar1->SliderCurrentAccum;
      if ((pIVar1->NavActivatePressedId == in_ESI) && ((pIVar1->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((pIVar1->SliderCurrentAccumDirty & 1U) != 0) {
        in_stack_ffffffffffffff7c =
             ScaleRatioFromValueT<double,double,double>
                       (data_type_01,
                        (double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                        (bool)in_stack_ffffffffffffff67,local_124,in_stack_ffffffffffffff5c);
        uVar14 = (undefined1)(data_type_01 >> 0x18);
        if (((1.0 <= in_stack_ffffffffffffff7c) && (0.0 < in_stack_ffffffffffffff5c)) ||
           ((in_stack_ffffffffffffff7c <= 0.0 && (in_stack_ffffffffffffff5c < 0.0)))) {
          data_type_01 = CONCAT13(uVar14,(uint3)(ushort)data_type_01);
          pIVar1->SliderCurrentAccum = 0.0;
        }
        else {
          data_type_01 = CONCAT13(uVar14,CONCAT12(1,(ushort)data_type_01));
          fVar8 = ImSaturate(in_stack_ffffffffffffff7c + in_stack_ffffffffffffff5c);
          dVar11 = ScaleValueFromRatioT<double,double,double>
                             ((ImGuiDataType)fVar8,in_stack_ffffffffffffff78,
                              (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              (bool)in_stack_ffffffffffffff67,local_124,in_stack_ffffffffffffff5c);
          data_type_00 = (ImGuiDataType)((ulong)dVar11 >> 0x20);
          in_stack_ffffffffffffff58 = in_stack_ffffffffffffff7c;
          if ((bVar5 || bVar6) && ((in_R9D & 0x40) == 0)) {
            dVar11 = RoundScalarWithFormatT<double>
                               ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff7c
                                                ),data_type_00,
                                (double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ));
            data_type_00 = (ImGuiDataType)((ulong)dVar11 >> 0x20);
            in_stack_ffffffffffffff58 = in_stack_ffffffffffffff7c;
          }
          in_stack_ffffffffffffff7c = fVar8;
          in_stack_ffffffffffffff4c =
               ScaleRatioFromValueT<double,double,double>
                         (data_type_01,
                          (double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (bool)in_stack_ffffffffffffff67,local_124,in_stack_ffffffffffffff5c);
          if (in_stack_ffffffffffffff5c <= 0.0) {
            fVar8 = ImMax<float>(in_stack_ffffffffffffff4c - in_stack_ffffffffffffff58,
                                 in_stack_ffffffffffffff5c);
            pIVar1->SliderCurrentAccum = pIVar1->SliderCurrentAccum - fVar8;
          }
          else {
            fVar8 = ImMin<float>(in_stack_ffffffffffffff4c - in_stack_ffffffffffffff58,
                                 in_stack_ffffffffffffff5c);
            pIVar1->SliderCurrentAccum = pIVar1->SliderCurrentAccum - fVar8;
          }
        }
        pIVar1->SliderCurrentAccumDirty = false;
      }
    }
    if ((data_type_01 & 0x10000) != 0) {
      local_c0 = ScaleValueFromRatioT<double,double,double>
                           ((ImGuiDataType)in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                            (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                            (bool)in_stack_ffffffffffffff67,local_124,in_stack_ffffffffffffff5c);
      if ((bVar5 || bVar6) && ((in_R9D & 0x40) == 0)) {
        local_c0 = RoundScalarWithFormatT<double>
                             ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                              data_type_00,
                              (double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
        ;
      }
      if ((*in_RCX != local_c0) || (NAN(*in_RCX) || NAN(local_c0))) {
        *in_RCX = local_c0;
        data_type_01 = CONCAT13(1,(int3)data_type_01);
      }
    }
  }
  if (1.0 <= fVar7) {
    local_d4 = ScaleRatioFromValueT<double,double,double>
                         (data_type_01,
                          (double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (bool)in_stack_ffffffffffffff67,local_124,in_stack_ffffffffffffff5c);
    bVar15 = (byte)(data_type_01 >> 0x18);
    if (uVar3 == 1) {
      local_d4 = 1.0 - local_d4;
    }
    ImLerp<float>(fVar9,fVar10,local_d4);
    if (uVar3 == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(axis_00,in_stack_fffffffffffffef0),in_stack_fffffffffffffeec
                     ,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
      ;
      *in_stack_00000008 = local_e8;
      in_stack_00000008[1] = local_e0;
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(axis_00,in_stack_fffffffffffffef0),in_stack_fffffffffffffeec
                     ,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
      ;
      *in_stack_00000008 = local_f8;
      in_stack_00000008[1] = local_f0;
    }
  }
  else {
    ImRect::ImRect(&local_d0,in_RDI,in_RDI);
    bVar15 = (byte)(data_type_01 >> 0x18);
    *in_stack_00000008 = local_d0.Min;
    in_stack_00000008[1] = local_d0.Max;
  }
  return (bool)(bVar15 & 1);
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);

    // Calculate bounds
    const float grab_padding = 2.0f; // FIXME: Should be part of style.
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    if (!is_floating_point && v_range >= 0)                                     // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize); // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                if (g.ActiveIdIsJustActivated)
                {
                    float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (axis == ImGuiAxis_Y)
                        grab_t = 1.0f - grab_t;
                    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
                    const bool clicked_around_grab = (mouse_abs_pos >= grab_pos - grab_sz * 0.5f - 1.0f) && (mouse_abs_pos <= grab_pos + grab_sz * 0.5f + 1.0f); // No harm being extra generous here.
                    g.SliderGrabClickOffset = (clicked_around_grab && is_floating_point) ? mouse_abs_pos - grab_pos : 0.0f;
                }
                if (slider_usable_sz > 0.0f)
                    clicked_t = ImSaturate((mouse_abs_pos - g.SliderGrabClickOffset - slider_usable_pos_min) / slider_usable_sz);
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            float input_delta = (axis == ImGuiAxis_X) ? GetNavTweakPressedAmount(axis) : -GetNavTweakPressedAmount(axis);
            if (input_delta != 0.0f)
            {
                const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
                const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (tweak_slow)
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || tweak_slow)
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (tweak_fast)
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}